

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O3

int Amap_LibCreateNode(Amap_Lib_t *p,int iFan0,int iFan1,int fXor)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  uint *puVar3;
  bool bVar4;
  Amap_Nod_t *pAVar5;
  void *pvVar6;
  long lVar7;
  uint uVar8;
  undefined8 uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  
  uVar14 = (ulong)(uint)iFan1;
  if (iFan0 < iFan1) {
    uVar14 = (ulong)(uint)iFan0;
  }
  uVar11 = (ulong)(uint)iFan1;
  if (iFan1 < iFan0) {
    uVar11 = (ulong)(uint)iFan0;
  }
  pAVar5 = Amap_LibCreateObj(p);
  uVar12 = *(uint *)pAVar5;
  uVar8 = (uVar12 & 0xffffff) + (uint)(fXor != 0) * 0x1000000 + 0x4000000;
  *(uint *)pAVar5 = uVar8;
  uVar10 = (uint)uVar11;
  if (((int)uVar10 < 0) || (uVar13 = (uint)uVar14, (int)uVar13 < 0)) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  *(uint *)pAVar5 =
       uVar8 & 0x500ffff |
       (uint)(byte)p->pNodes[uVar11 >> 1].field_0x2 * 0x10000 + *(int *)(p->pNodes + (uVar14 >> 1))
       & 0xff0000;
  pAVar5->iFan0 = (short)uVar11;
  pAVar5->iFan1 = (short)uVar14;
  if (p->fVerbose != 0) {
    uVar9 = 0x78;
    if (fXor == 0) {
      uVar9 = 0x20;
    }
    printf("Creating node %5d %c :  iFan0 = %5d%c  iFan1 = %5d%c\n",(ulong)(uVar12 & 0xffff),uVar9,
           uVar11 >> 1,(ulong)((uVar10 & 1) * 2 + 0x2b),uVar14 >> 1,(uVar13 & 1) * 2 + 0x2b);
  }
  if (fXor == 0) {
    pVVar2 = p->vRules;
    if (iFan1 == iFan0) {
      if (pVVar2->nSize <= (int)uVar10) goto LAB_00420135;
      puVar3 = (uint *)pVVar2->pArray[uVar11];
      iVar1 = *(int *)pAVar5;
      uVar12 = puVar3[1];
      uVar14 = (ulong)uVar12;
      if (uVar12 == *puVar3) {
        if ((int)uVar12 < (int)(uVar12 * 2)) {
          if (*(void **)(puVar3 + 2) == (void *)0x0) {
            pvVar6 = malloc((long)(int)uVar12 << 3);
          }
          else {
            pvVar6 = realloc(*(void **)(puVar3 + 2),(long)(int)uVar12 << 3);
          }
          *(void **)(puVar3 + 2) = pvVar6;
          if (pvVar6 == (void *)0x0) goto LAB_00420154;
          *puVar3 = uVar12 * 2;
          uVar14 = (ulong)puVar3[1];
        }
      }
      uVar12 = iVar1 << 0x10 | uVar13;
      puVar3[1] = (int)uVar14 + 1;
      lVar7 = *(long *)(puVar3 + 2);
      if ((int)uVar14 < 1) goto LAB_004200fe;
      do {
        uVar8 = *(uint *)(lVar7 + -4 + uVar14 * 4);
        if ((uVar8 & 0xffff) <= (uVar13 & 0xffff)) goto LAB_004200fe;
        *(uint *)(lVar7 + uVar14 * 4) = uVar8;
        bVar4 = 1 < uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar4);
    }
    else {
      if (pVVar2->nSize <= (int)uVar10) goto LAB_00420135;
      puVar3 = (uint *)pVVar2->pArray[uVar11];
      iVar1 = *(int *)pAVar5;
      uVar12 = puVar3[1];
      uVar11 = (ulong)uVar12;
      if (uVar12 == *puVar3) {
        if ((int)uVar12 < (int)(uVar12 * 2)) {
          if (*(void **)(puVar3 + 2) == (void *)0x0) {
            pvVar6 = malloc((long)(int)uVar12 << 3);
          }
          else {
            pvVar6 = realloc(*(void **)(puVar3 + 2),(long)(int)uVar12 << 3);
          }
          *(void **)(puVar3 + 2) = pvVar6;
          if (pvVar6 == (void *)0x0) goto LAB_00420154;
          *puVar3 = uVar12 * 2;
          uVar11 = (ulong)puVar3[1];
        }
      }
      puVar3[1] = (int)uVar11 + 1;
      lVar7 = *(long *)(puVar3 + 2);
      if (0 < (int)uVar11) {
        do {
          uVar12 = *(uint *)(lVar7 + -4 + uVar11 * 4);
          if ((uVar12 & 0xffff) <= (uVar13 & 0xffff)) goto LAB_0042005a;
          *(uint *)(lVar7 + uVar11 * 4) = uVar12;
          bVar4 = 1 < uVar11;
          uVar11 = uVar11 - 1;
        } while (bVar4);
        uVar11 = 0;
      }
LAB_0042005a:
      *(uint *)(lVar7 + (long)(int)uVar11 * 4) = iVar1 << 0x10 | uVar13;
      if (p->vRules->nSize <= (int)uVar13) goto LAB_00420135;
      puVar3 = (uint *)p->vRules->pArray[uVar14];
      iVar1 = *(int *)pAVar5;
      uVar12 = puVar3[1];
      uVar14 = (ulong)uVar12;
      if (uVar12 == *puVar3) {
        if ((int)uVar12 < (int)(uVar12 * 2)) {
          if (*(void **)(puVar3 + 2) == (void *)0x0) {
            pvVar6 = malloc((long)(int)uVar12 << 3);
          }
          else {
            pvVar6 = realloc(*(void **)(puVar3 + 2),(long)(int)uVar12 << 3);
          }
          *(void **)(puVar3 + 2) = pvVar6;
          if (pvVar6 == (void *)0x0) goto LAB_00420154;
          *puVar3 = uVar12 * 2;
          uVar14 = (ulong)puVar3[1];
        }
      }
      uVar12 = iVar1 << 0x10 | uVar10;
      puVar3[1] = (int)uVar14 + 1;
      lVar7 = *(long *)(puVar3 + 2);
      if ((int)uVar14 < 1) goto LAB_004200fe;
      do {
        uVar8 = *(uint *)(lVar7 + -4 + uVar14 * 4);
        if ((uVar8 & 0xffff) <= (uVar10 & 0xffff)) goto LAB_004200fe;
        *(uint *)(lVar7 + uVar14 * 4) = uVar8;
        bVar4 = 1 < uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar4);
    }
  }
  else {
    pVVar2 = p->vRulesX;
    if (iFan1 == iFan0) {
      if (pVVar2->nSize <= (int)uVar10) goto LAB_00420135;
      puVar3 = (uint *)pVVar2->pArray[uVar11];
      iVar1 = *(int *)pAVar5;
      uVar12 = puVar3[1];
      uVar14 = (ulong)uVar12;
      if (uVar12 == *puVar3) {
        if ((int)uVar12 < (int)(uVar12 * 2)) {
          if (*(void **)(puVar3 + 2) == (void *)0x0) {
            pvVar6 = malloc((long)(int)uVar12 << 3);
          }
          else {
            pvVar6 = realloc(*(void **)(puVar3 + 2),(long)(int)uVar12 << 3);
          }
          *(void **)(puVar3 + 2) = pvVar6;
          if (pvVar6 == (void *)0x0) {
LAB_00420154:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          *puVar3 = uVar12 * 2;
          uVar14 = (ulong)puVar3[1];
        }
      }
      uVar12 = iVar1 << 0x10 | uVar13;
      puVar3[1] = (int)uVar14 + 1;
      lVar7 = *(long *)(puVar3 + 2);
      if ((int)uVar14 < 1) goto LAB_004200fe;
      do {
        uVar8 = *(uint *)(lVar7 + -4 + uVar14 * 4);
        if ((uVar8 & 0xffff) <= (uVar13 & 0xffff)) goto LAB_004200fe;
        *(uint *)(lVar7 + uVar14 * 4) = uVar8;
        bVar4 = 1 < uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar4);
    }
    else {
      if (pVVar2->nSize <= (int)uVar10) {
LAB_00420135:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar3 = (uint *)pVVar2->pArray[uVar11];
      iVar1 = *(int *)pAVar5;
      uVar12 = puVar3[1];
      uVar11 = (ulong)uVar12;
      if (uVar12 == *puVar3) {
        if ((int)uVar12 < (int)(uVar12 * 2)) {
          if (*(void **)(puVar3 + 2) == (void *)0x0) {
            pvVar6 = malloc((long)(int)uVar12 << 3);
          }
          else {
            pvVar6 = realloc(*(void **)(puVar3 + 2),(long)(int)uVar12 << 3);
          }
          *(void **)(puVar3 + 2) = pvVar6;
          if (pvVar6 == (void *)0x0) goto LAB_00420154;
          *puVar3 = uVar12 * 2;
          uVar11 = (ulong)puVar3[1];
        }
      }
      puVar3[1] = (int)uVar11 + 1;
      lVar7 = *(long *)(puVar3 + 2);
      if (0 < (int)uVar11) {
        do {
          uVar12 = *(uint *)(lVar7 + -4 + uVar11 * 4);
          if ((uVar12 & 0xffff) <= (uVar13 & 0xffff)) goto LAB_0041fef2;
          *(uint *)(lVar7 + uVar11 * 4) = uVar12;
          bVar4 = 1 < uVar11;
          uVar11 = uVar11 - 1;
        } while (bVar4);
        uVar11 = 0;
      }
LAB_0041fef2:
      *(uint *)(lVar7 + (long)(int)uVar11 * 4) = iVar1 << 0x10 | uVar13;
      if (p->vRulesX->nSize <= (int)uVar13) goto LAB_00420135;
      puVar3 = (uint *)p->vRulesX->pArray[uVar14];
      iVar1 = *(int *)pAVar5;
      uVar12 = puVar3[1];
      uVar14 = (ulong)uVar12;
      if (uVar12 == *puVar3) {
        if ((int)uVar12 < (int)(uVar12 * 2)) {
          if (*(void **)(puVar3 + 2) == (void *)0x0) {
            pvVar6 = malloc((long)(int)uVar12 << 3);
          }
          else {
            pvVar6 = realloc(*(void **)(puVar3 + 2),(long)(int)uVar12 << 3);
          }
          *(void **)(puVar3 + 2) = pvVar6;
          if (pvVar6 == (void *)0x0) goto LAB_00420154;
          *puVar3 = uVar12 * 2;
          uVar14 = (ulong)puVar3[1];
        }
      }
      uVar12 = iVar1 << 0x10 | uVar10;
      puVar3[1] = (int)uVar14 + 1;
      lVar7 = *(long *)(puVar3 + 2);
      if ((int)uVar14 < 1) goto LAB_004200fe;
      do {
        uVar8 = *(uint *)(lVar7 + -4 + uVar14 * 4);
        if ((uVar8 & 0xffff) <= (uVar10 & 0xffff)) goto LAB_004200fe;
        *(uint *)(lVar7 + uVar14 * 4) = uVar8;
        bVar4 = 1 < uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar4);
    }
  }
  uVar14 = 0;
LAB_004200fe:
  *(uint *)(lVar7 + (long)(int)uVar14 * 4) = uVar12;
  return (int)*(ushort *)pAVar5;
}

Assistant:

int Amap_LibCreateNode( Amap_Lib_t * p, int iFan0, int iFan1, int fXor )
{
    Amap_Nod_t * pNode;
    int iFan;
    if ( iFan0 < iFan1 )
    {
        iFan  = iFan0;
        iFan0 = iFan1;
        iFan1 = iFan;
    }
    pNode = Amap_LibCreateObj( p );
    pNode->Type  = fXor? AMAP_OBJ_XOR : AMAP_OBJ_AND;
    pNode->nSuppSize = p->pNodes[Abc_Lit2Var(iFan0)].nSuppSize + p->pNodes[Abc_Lit2Var(iFan1)].nSuppSize;
    pNode->iFan0 = iFan0;
    pNode->iFan1 = iFan1;
if ( p->fVerbose )
printf( "Creating node %5d %c :  iFan0 = %5d%c  iFan1 = %5d%c\n", 
pNode->Id, (fXor?'x':' '), 
Abc_Lit2Var(iFan0), (Abc_LitIsCompl(iFan0)?'-':'+'), 
Abc_Lit2Var(iFan1), (Abc_LitIsCompl(iFan1)?'-':'+') );

    if ( fXor )
    {
        if ( iFan0 == iFan1 )
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRulesX, iFan0), (pNode->Id << 16) | iFan1 );
        else
        {
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRulesX, iFan0), (pNode->Id << 16) | iFan1 );
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRulesX, iFan1), (pNode->Id << 16) | iFan0 );
        }
    }
    else
    {
        if ( iFan0 == iFan1 )
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRules, iFan0), (pNode->Id << 16) | iFan1 );
        else
        {
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRules, iFan0), (pNode->Id << 16) | iFan1 );
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRules, iFan1), (pNode->Id << 16) | iFan0 );
        }
    }
    return pNode->Id;
}